

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_simplify.c
# Opt level: O3

lua_Integer intarith(CompilerState *compiler_state,int op,lua_Integer v1,lua_Integer v2)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  
  switch(op) {
  case 0:
    uVar2 = v2 + v1;
    break;
  case 1:
    uVar2 = v1 - v2;
    break;
  case 2:
    uVar2 = v2 * v1;
    break;
  case 3:
    if (v2 + 1U < 2) {
      intarith_cold_1();
    }
    else {
      uVar2 = v1 % v2;
      if (uVar2 != 0) {
        return ((long)(uVar2 ^ v2) >> 0x3f & v2) + uVar2;
      }
    }
    goto LAB_0010ac72;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/ast_simplify.c"
                  ,0x10a,"lua_Integer intarith(CompilerState *, int, lua_Integer, lua_Integer)");
  case 6:
    if (1 < v2 + 1U) {
      if (-1 < (v2 ^ v1)) {
        return v1 / v2;
      }
      return v1 / v2 + -1 + (ulong)(v1 % v2 == 0);
    }
    if (v2 == 0) {
      raviX_buffer_add_string(&compiler_state->error_message,"attempt to divide by zero");
      longjmp((__jmp_buf_tag *)compiler_state->env,1);
    }
  case 0x16:
    uVar2 = -v1;
    break;
  case 7:
    uVar2 = v2 & v1;
    break;
  case 8:
    uVar2 = v2 | v1;
    break;
  case 9:
    uVar2 = v2 ^ v1;
    break;
  case 10:
    if (-1 < v2) {
      bVar3 = (ulong)v2 < 0x40;
      uVar1 = v2 & 0x3f;
      goto LAB_0010ac7f;
    }
    if (0xffffffffffffffc0 < (ulong)v2) {
      return v1 >> ((ulong)(byte)-(char)v2 & 0x3f);
    }
LAB_0010ac72:
    uVar2 = 0;
    break;
  case 0xb:
    uVar1 = -v2;
    if (0 < v2) {
      if (uVar1 < 0xffffffffffffffc1) {
        return 0;
      }
      return v1 >> (v2 & 0x3fU);
    }
    bVar3 = uVar1 < 0x40;
    uVar1 = uVar1 & 0x3f;
LAB_0010ac7f:
    uVar2 = 0;
    if (bVar3) {
      uVar2 = v1 << uVar1;
    }
    break;
  case 0x17:
    uVar2 = ~v1;
  }
  return uVar2;
}

Assistant:

static lua_Integer intarith(CompilerState *compiler_state, int op, lua_Integer v1, lua_Integer v2)
{
	switch (op) {
	case BINOPR_ADD:
		return v1 + v2;
	case BINOPR_SUB:
		return v1 - v2;
	case BINOPR_MUL:
		return v1 * v2;
	case BINOPR_MOD:
		return luaV_mod(compiler_state, v1, v2);
	case BINOPR_IDIV:
		return luaV_idiv(compiler_state, v1, v2);
	case BINOPR_BAND:
		return v1 & v2;
	case BINOPR_BOR:
		return v1 | v2;
	case BINOPR_BXOR:
		return v1 ^ v2;
	case BINOPR_SHL:
		return luaV_shiftl(v1, v2);
	case BINOPR_SHR:
		return luaV_shiftl(v1, -v2);
	case UNOPR_MINUS:
		return 0 - v1;
	case UNOPR_BNOT:
		return ~l_castS2U(0) ^ v1;
	default:
		assert(0);
		return 0;
	}
}